

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void __thiscall cimg_library::CImgDisplay::_desinit_fullscreen(CImgDisplay *this)

{
  Display *pDVar1;
  int iVar2;
  
  if (this->_is_fullscreen == true) {
    if (cimg::X11_attr()::val == '\0') {
      iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val);
      if (iVar2 != 0) {
        cimg::X11_static::X11_static(&cimg::X11_attr::val);
        __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
        __cxa_guard_release(&cimg::X11_attr()::val);
      }
    }
    pDVar1 = cimg::X11_attr::val.display;
    XUngrabKeyboard(cimg::X11_attr::val.display,0);
    if (this->_background_window != 0) {
      XDestroyWindow(pDVar1);
    }
    this->_background_window = 0;
    this->_is_fullscreen = false;
  }
  return;
}

Assistant:

void _desinit_fullscreen() {
      if (!_is_fullscreen) return;
      Display *const dpy = cimg::X11_attr().display;
      XUngrabKeyboard(dpy,CurrentTime);

#ifdef cimg_use_xrandr
      if (cimg::X11_attr().resolutions && cimg::X11_attr().curr_resolution) {
        XRRScreenConfiguration *config = XRRGetScreenInfo(dpy,DefaultRootWindow(dpy));
        XRRSetScreenConfig(dpy,config,DefaultRootWindow(dpy),0,cimg::X11_attr().curr_rotation,CurrentTime);
        XRRFreeScreenConfigInfo(config);
        XSync(dpy,0);
        cimg::X11_attr().curr_resolution = 0;
      }
#endif
      if (_background_window) XDestroyWindow(dpy,_background_window);
      _background_window = 0;
      _is_fullscreen = false;
    }